

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

int pbrt::ParameterTypeTraits<(pbrt::ParameterType)2>::Convert(double *v,FileLoc *loc)

{
  double dVar1;
  undefined8 uVar2;
  bool bVar3;
  char *fmt;
  int *args_1;
  undefined1 auVar4 [16];
  int local_10 [2];
  
  dVar1 = *v;
  if (dVar1 <= 2147483647.0) {
    if (-2147483648.0 <= dVar1) {
      auVar4 = vcvtdq2pd_avx(ZEXT416((uint)(int)dVar1));
      if ((dVar1 != auVar4._0_8_) || (NAN(dVar1) || NAN(auVar4._0_8_))) {
        Warning<double_const&>(loc,"Floating-point value %f will be rounded to an integer",v);
      }
      goto LAB_00255c44;
    }
    args_1 = local_10;
    fmt = "Numeric value %f too low to represent as an integer. Clamping to %d";
    local_10[0] = -0x80000000;
  }
  else {
    args_1 = local_10 + 1;
    fmt = "Numeric value %f too large to represent as an integer. Clamping to %d";
    local_10[1] = 0x7fffffff;
  }
  Warning<double_const&,int>(loc,fmt,v,args_1);
LAB_00255c44:
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *v;
  uVar2 = vcmpsd_avx512f(auVar4,ZEXT816(0xc1e0000000000000),1);
  bVar3 = (bool)((byte)uVar2 & 1);
  auVar4 = vminsd_avx(ZEXT816(0x41dfffffffc00000),auVar4);
  return (int)(double)((ulong)bVar3 * -0x3e20000000000000 + (ulong)!bVar3 * auVar4._0_8_);
}

Assistant:

static int Convert(const double *v, const FileLoc *loc) {
        if (*v > std::numeric_limits<int>::max())
            Warning(loc,
                    "Numeric value %f too large to represent as an integer. "
                    "Clamping to %d",
                    *v, std::numeric_limits<int>::max());
        else if (*v < std::numeric_limits<int>::lowest())
            Warning(loc,
                    "Numeric value %f too low to represent as an integer. "
                    "Clamping to %d",
                    *v, std::numeric_limits<int>::lowest());
        else if (double(int(*v)) != *v)
            Warning(loc, "Floating-point value %f will be rounded to an integer", *v);

        return int(Clamp(*v, std::numeric_limits<int>::lowest(),
                         std::numeric_limits<int>::max()));
    }